

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

PClassWeapon * Net_ReadWeapon(BYTE **stream)

{
  int iVar1;
  uint uVar2;
  PClassWeapon **ppPVar3;
  uint local_1c;
  int index;
  BYTE **stream_local;
  
  local_1c = ReadByte(stream);
  if ((local_1c & 0x80) != 0) {
    iVar1 = ReadByte(stream);
    local_1c = local_1c & 0x7f | iVar1 << 7;
  }
  uVar2 = TArray<PClassWeapon_*,_PClassWeapon_*>::Size(&Weapons_ntoh);
  if (local_1c < uVar2) {
    ppPVar3 = TArray<PClassWeapon_*,_PClassWeapon_*>::operator[](&Weapons_ntoh,(long)(int)local_1c);
    stream_local = (BYTE **)*ppPVar3;
  }
  else {
    stream_local = (BYTE **)0x0;
  }
  return (PClassWeapon *)stream_local;
}

Assistant:

PClassWeapon *Net_ReadWeapon(BYTE **stream)
{
	int index;

	index = ReadByte(stream);
	if (index & 0x80)
	{
		index = (index & 0x7F) | (ReadByte(stream) << 7);
	}
	if ((unsigned)index >= Weapons_ntoh.Size())
	{
		return NULL;
	}
	return Weapons_ntoh[index];
}